

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

void cleanup_act(void)

{
  ulong uVar1;
  long lVar2;
  
  if (z_info->act_max != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      string_free(*(char **)((long)&activations->name + lVar2));
      mem_free(*(void **)((long)&activations->desc + lVar2));
      mem_free(*(void **)((long)&activations->message + lVar2));
      free_effect(*(effect **)((long)&activations->effect + lVar2));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x38;
    } while (uVar1 < z_info->act_max);
  }
  mem_free(activations);
  return;
}

Assistant:

static void cleanup_act(void)
{
	int idx;
	for (idx = 0; idx < z_info->act_max; idx++) {
		string_free(activations[idx].name);
		mem_free(activations[idx].desc);
		mem_free(activations[idx].message);
		free_effect(activations[idx].effect);
	}
	mem_free(activations);
}